

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::Subtract
          (TPZMatrix<Fad<double>_> *this,TPZMatrix<Fad<double>_> *A,TPZMatrix<Fad<double>_> *res)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<Fad<double>_> *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fad<double> *pFVar5;
  TPZMatrix<Fad<double>_> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000001c8;
  char *in_stack_000001d0;
  int64_t c;
  int64_t r;
  TPZFMatrix<Fad<double>_> *resFmat;
  TPZFMatrix<Fad<double>_> *aFmat;
  TPZFMatrix<Fad<double>_> *thisFmat;
  long local_230;
  TPZMatrix<Fad<double>_> *pTVar6;
  Fad<double> *pFVar7;
  TPZBaseMatrix *pTVar8;
  long local_210;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe00;
  undefined1 local_b0 [32];
  undefined1 local_90 [48];
  undefined1 local_60 [8];
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  long local_40;
  Fad<double> *local_38;
  TPZMatrix<Fad<double>_> *aBase;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar2 == iVar3) {
    in_stack_fffffffffffffe00 = (TPZFMatrix<Fad<double>_> *)TPZBaseMatrix::Cols(in_RDI);
    pTVar4 = (TPZFMatrix<Fad<double>_> *)TPZBaseMatrix::Cols(in_RSI);
    if (in_stack_fffffffffffffe00 == pTVar4) goto LAB_0132f049;
  }
  Error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_0132f049:
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  aBase = (TPZMatrix<Fad<double>_> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (aBase != (TPZMatrix<Fad<double>_> *)CONCAT44(extraout_var_00,iVar1)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<Fad<double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_000001d0,in_stack_000001c8);
  }
  (*(in_RDX->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(in_RDX,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    local_210 = 0;
  }
  else {
    local_210 = __dynamic_cast(in_RDI,&TPZMatrix<Fad<double>>::typeinfo,
                               &TPZFMatrix<Fad<double>>::typeinfo,0);
  }
  pTVar8 = in_RSI;
  if (in_RSI == (TPZBaseMatrix *)0x0) {
    pFVar5 = (Fad<double> *)0x0;
  }
  else {
    pFVar5 = (Fad<double> *)
             __dynamic_cast(in_RSI,&TPZMatrix<Fad<double>>::typeinfo,
                            &TPZFMatrix<Fad<double>>::typeinfo,0);
  }
  pTVar6 = in_RDX;
  pFVar7 = pFVar5;
  if (in_RDX == (TPZMatrix<Fad<double>_> *)0x0) {
    local_230 = 0;
  }
  else {
    local_230 = __dynamic_cast(in_RDX,&TPZMatrix<Fad<double>>::typeinfo,
                               &TPZFMatrix<Fad<double>>::typeinfo,0);
  }
  if ((local_230 == 0) || ((local_210 != 0 && (pFVar5 != (Fad<double> *)0x0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,in_RDX,in_RSI);
    Storage(pTVar6);
    Storage(pTVar6);
    TPZFMatrix<Fad<double>_>::operator-=(in_stack_fffffffffffffe00,aBase);
    TPZFMatrixRef<Fad<double>_>::~TPZFMatrixRef((TPZFMatrixRef<Fad<double>_> *)0x132f45f);
    TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x132f46c);
  }
  else {
    for (local_38 = (Fad<double> *)0x0; iVar2 = TPZBaseMatrix::Rows(in_RDI), (long)local_38 < iVar2;
        local_38 = (Fad<double> *)((long)&local_38->val_ + 1)) {
      for (local_40 = 0; iVar2 = TPZBaseMatrix::Cols(in_RDI), local_40 < iVar2;
          local_40 = local_40 + 1) {
        pFVar5 = local_38;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_90);
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,in_RSI,local_38,local_40);
        operator-<Fad<double>,_Fad<double>,_nullptr>((Fad<double> *)pTVar8,pFVar7);
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                  ((Fad<double> *)in_stack_fffffffffffffe00,
                   (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)aBase);
        (*(in_RDX->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (in_RDX,pFVar5,local_40,local_60);
        Fad<double>::~Fad(pFVar5);
        FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)pFVar5);
        Fad<double>::~Fad(pFVar5);
        Fad<double>::~Fad(pFVar5);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}